

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int luaopen_string(lua_State *L)

{
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,0x11);
  luaL_setfuncs(L,strlib,0);
  lua_createtable(L,0,9);
  luaL_setfuncs(L,stringmetamethods,0);
  lua_pushstring(L,"");
  lua_pushvalue(L,-2);
  lua_setmetatable(L,-2);
  lua_settop(L,-2);
  lua_pushvalue(L,-2);
  lua_setfield(L,-2,"__index");
  lua_settop(L,-2);
  return 1;
}

Assistant:

LUAMOD_API int luaopen_string (lua_State *L) {
  luaL_newlib(L, strlib);
  createmetatable(L);
  return 1;
}